

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_mem_segment_info(mem_segment sec)

{
  mem_pointer plVar1;
  uint local_24;
  int i;
  mem_pointer mem_segment_addr;
  mem_segment sec_local;
  
  for (local_24 = 0; local_24 < sec.mem_segment_count; local_24 = local_24 + 1) {
    plVar1 = sec.mem_segment_addr + (int)local_24;
    printf("  - memory[%d]: pages ",(ulong)local_24);
    printf("min=%d",(ulong)plVar1->min);
    if (plVar1->tag == '\x01') {
      printf(" max=%d",(ulong)plVar1->max);
    }
    puts("");
  }
  return;
}

Assistant:

void print_mem_segment_info(mem_segment sec) {
    mem_pointer mem_segment_addr;
    for (int i = 0; i < sec.mem_segment_count; ++i) {
        mem_segment_addr = sec.mem_segment_addr + i;
        printf("  - memory[%d]: pages ", i);
        printf("min=%d", mem_segment_addr->min);
        if (mem_segment_addr->tag == min_and_max)
            printf(" max=%d", mem_segment_addr->max);
        puts("");
    }
}